

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O0

void __thiscall
Eigen::HouseholderSequence<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,1,0,4,1>,1>::
applyThisOnTheLeft<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,1,1,1,1,1>>
          (HouseholderSequence<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>
           *this,Matrix<double,_4,_1,_0,_4,_1> *dst,Matrix<double,_1,_1,_1,_1,_1> *workspace)

{
  Index in_RDX;
  PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *in_RSI;
  HouseholderSequence<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>
  *in_RDI;
  Index actual_k;
  Index k;
  Scalar *in_stack_00000158;
  Scalar *in_stack_00000160;
  Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,_1,_false> *in_stack_00000168;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *in_stack_00000170;
  Index in_stack_ffffffffffffff58;
  PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_00;
  Index in_stack_ffffffffffffff68;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_> *in_stack_ffffffffffffff70;
  long k_00;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *in_stack_ffffffffffffff88;
  long local_20;
  
  PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::cols
            ((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)0x2b0156);
  PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>::resize
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  for (local_20 = 0; local_20 < in_RDI->m_length; local_20 = local_20 + 1) {
    k_00 = local_20;
    if ((in_RDI->m_trans & 1U) == 0) {
      k_00 = (in_RDI->m_length - local_20) + -1;
    }
    this_00 = in_RSI;
    HouseholderSequence<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>
    ::rows((HouseholderSequence<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>
            *)0x2b01de);
    DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::bottomRows(in_stack_ffffffffffffff88,in_RDX);
    HouseholderSequence<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>
    ::essentialVector(in_RDI,k_00);
    PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::coeff(this_00,in_stack_ffffffffffffff58)
    ;
    PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>::data
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_> *)0x2b0240);
    MatrixBase<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>>::
    applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>const,_1,1,false>>
              (in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158);
  }
  return;
}

Assistant:

inline void applyThisOnTheLeft(Dest& dst, Workspace& workspace) const
    {
      workspace.resize(dst.cols());
      for(Index k = 0; k < m_length; ++k)
      {
        Index actual_k = m_trans ? k : m_length-k-1;
        dst.bottomRows(rows()-m_shift-actual_k)
           .applyHouseholderOnTheLeft(essentialVector(actual_k), m_coeffs.coeff(actual_k), workspace.data());
      }
    }